

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O3

void __thiscall Sequence::newSeq(Sequence *this)

{
  int *__args;
  int iVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer psVar4;
  pointer psVar5;
  bool bVar6;
  element_type *peVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  long lVar11;
  FreqIt_SS fit;
  undefined1 local_61;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_> *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  long local_38;
  
  peVar7 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar7->use_hash != 0) {
    std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>::reserve
              ((this->FreqArray).
               super___shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,this->FreqArraySz);
    peVar7 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  iVar1 = peVar7->use_ascending;
  if ((long)iVar1 == -2) {
    if (0 < (long)peVar7->dbase_max_item) {
      __args = &this->FreqArrayPos;
      lVar9 = (long)peVar7->dbase_max_item;
      do {
        lVar11 = lVar9 + -1;
        psVar2 = (((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->eqgraph).
                 super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = *(long *)&psVar2[lVar11].super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>;
        this_00._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(psVar2 + lVar11) + 8);
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          }
        }
        if (lVar10 != 0) {
          if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              use_hash != 0) {
            *__args = 0;
          }
          process_class(this,(int)lVar11);
          if ((((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->use_hash != 0) && (0 < this->FreqArrayPos)) {
            local_58 = (vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_> *
                       )0x0;
            local_60 = this_00._M_pi;
            local_38 = lVar11;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::vector<std::shared_ptr<FreqIt>,std::allocator<std::shared_ptr<FreqIt>>>,std::allocator<std::vector<std::shared_ptr<FreqIt>,std::allocator<std::shared_ptr<FreqIt>>>>,int&>
                      (&local_50,&local_58,
                       (allocator<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>_>
                        *)&local_61,__args);
            if (0 < *__args) {
              lVar10 = 8;
              uVar8 = 0;
              do {
                peVar3 = (this->FreqArray).
                         super___shared_ptr<std::vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                psVar4 = (peVar3->
                         super__Vector_base<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                if (((ulong)((long)(peVar3->
                                   super__Vector_base<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar4 >> 4)
                     <= uVar8) ||
                   (psVar5 = (local_58->
                             super__Vector_base<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                   (ulong)((long)(local_58->
                                 super__Vector_base<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)psVar5 >> 4) <=
                   uVar8)) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar8);
                }
                *(undefined8 *)((long)psVar5 + lVar10 + -8) =
                     *(undefined8 *)((long)psVar4 + lVar10 + -8);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)&(psVar5->super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr + lVar10),
                           (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)&psVar4->super___shared_ptr<FreqIt,_(__gnu_cxx::_Lock_policy)2> +
                           lVar10));
                uVar8 = uVar8 + 1;
                lVar10 = lVar10 + 0x10;
              } while ((long)uVar8 < (long)*__args);
            }
            lVar11 = *(long *)&(((this->invdb).
                                 super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->eqgraph).
                               super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar11].
                               super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2>;
            local_48 = local_58;
            local_40._M_pi = local_50._M_pi;
            if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
              }
            }
            iVar1 = *__args;
            *(vector<std::shared_ptr<FreqIt>,_std::allocator<std::shared_ptr<FreqIt>_>_> **)
             (lVar11 + 0x40) = local_58;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar11 + 0x48),&local_40);
            *(int *)(lVar11 + 0x50) = iVar1;
            if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
            }
            lVar11 = local_38;
            this_00._M_pi = local_60;
            if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
            }
          }
        }
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
        bVar6 = 1 < lVar9;
        lVar9 = lVar11;
      } while (bVar6);
    }
  }
  else if (iVar1 == -1) {
    if (0 < peVar7->dbase_max_item) {
      lVar11 = 0;
      lVar9 = 0;
      do {
        if (*(long *)((long)&((((this->invdb).
                                super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->eqgraph).
                              super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2> + lVar11) != 0
           ) {
          process_class(this,(int)lVar9);
          peVar7 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        }
        lVar9 = lVar9 + 1;
        lVar11 = lVar11 + 0x10;
      } while (lVar9 < peVar7->dbase_max_item);
    }
  }
  else if (*(long *)&(((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->eqgraph).
                     super__Vector_base<std::shared_ptr<EqGrNode>,_std::allocator<std::shared_ptr<EqGrNode>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar1].
                     super___shared_ptr<EqGrNode,_(__gnu_cxx::_Lock_policy)2> != 0) {
    process_class(this,iVar1);
    return;
  }
  return;
}

Assistant:

void Sequence::newSeq() {
    int i, j;

    if (args->use_hash) {
        FreqArray->reserve(FreqArraySz);
    }
    //form large itemsets for each eqclass
    if (args->use_ascending != -2) {
        if (args->use_ascending == -1) {
            for (i = 0; i < args->dbase_max_item; i++)
                if (invdb->get_eqgraph_item(i)) {
                    process_class(i);
                }
        } else if (invdb->get_eqgraph_item(args->use_ascending))
            process_class(args->use_ascending);
    } else {
        for (i = args->dbase_max_item - 1; i >= 0; i--) {
            auto x = invdb->get_eqgraph_item(i);
            if (x != nullptr) {
                if (args->use_hash) FreqArrayPos = 0;
                process_class(i);
                if (args->use_hash) {
                    if (FreqArrayPos > 0) {
                        FreqIt_SS fit = make_shared<vector<FreqIt_S>>(FreqArrayPos);
                        for (j = 0; j < FreqArrayPos; j++) {
                            fit->at(j) = FreqArray->at(j);
                        }
                        invdb->get_eqgraph_item(i)->set_freqarray(fit, FreqArrayPos);
                    }
                }
            }
        }
    }
}